

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

value_type *
winmd::reader::FixedArgSig::read_arg
          (value_type *__return_storage_ptr__,database *db,ParamSig *ctor_param,byte_view *data)

{
  uint uVar1;
  bool bVar2;
  vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> elems;
  allocator<char> local_69;
  _Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> local_68;
  string local_50;
  
  if ((ctor_param->m_type).m_is_szarray == true) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = read<unsigned_int>(data);
    if (uVar1 == 0xffffffff) {
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_68._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_68._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_68._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    }
    else {
      if ((uint)(*(int *)&data->m_last - *(int *)&data->m_first) < uVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Invalid blob array size",&local_69);
        impl::throw_invalid(&local_50);
      }
      std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::reserve
                ((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)
                 &local_68,(ulong)uVar1);
      while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
        std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>::
        emplace_back<winmd::reader::database_const&,winmd::reader::ParamSig_const&,winmd::reader::byte_view&>
                  ((vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>> *)
                   &local_68,db,ctor_param,data);
      }
    }
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
      ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      _M_u = local_68._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 4) = local_68._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 8) = local_68._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 0xc) = local_68._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             ).
             super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             ._M_u + 0x10) = local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
    ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    _M_index = '\x01';
    std::_Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::
    ~_Vector_base(&local_68);
  }
  else {
    ElemSig::read_element((value_type *)__return_storage_ptr__,db,ctor_param,data);
    (__return_storage_ptr__->
    super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
    ).super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
    _M_index = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_arg(database const& db, ParamSig const& ctor_param, byte_view& data)
        {
            auto const& type_sig = ctor_param.Type();
            if (type_sig.is_szarray())
            {
                std::vector<ElemSig> elems;
                auto const num_elements = read<uint32_t>(data);
                if (num_elements != 0xffffffff)
                {
                    if (num_elements > data.size())
                    {
                        impl::throw_invalid("Invalid blob array size");
                    }
                    elems.reserve(num_elements);
                    for (uint32_t i = 0; i < num_elements; ++i)
                    {
                        elems.emplace_back(db, ctor_param, data);
                    }
                }
                return elems;
            }
            else
            {
                return ElemSig{ db, ctor_param, data };
            }
        }